

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_cross_entropy_loss_back(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  uint n;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  void *pvVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  float *x;
  float *y;
  int64_t i1;
  long lVar12;
  ggml_float gVar13;
  float local_5c;
  ggml_tensor *local_58;
  float local_4c;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  long local_38;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x2212,"fatal error");
  }
  local_58 = dst->src[2];
  pgVar4 = dst->src[1];
  cVar7 = ggml_is_contiguous(dst);
  if (cVar7 == '\0') {
    pcVar10 = "ggml_is_contiguous(dst)";
    uVar11 = 0x21ce;
  }
  else {
    cVar7 = ggml_is_contiguous(pgVar4);
    if (cVar7 == '\0') {
      pcVar10 = "ggml_is_contiguous(src0f)";
      uVar11 = 0x21cf;
    }
    else {
      cVar7 = ggml_is_contiguous(local_58);
      if (cVar7 == '\0') {
        pcVar10 = "ggml_is_contiguous(src1f)";
        uVar11 = 0x21d0;
      }
      else {
        cVar7 = ggml_is_contiguous(pgVar3);
        if (cVar7 == '\0') {
          pcVar10 = "ggml_is_contiguous(grad)";
          uVar11 = 0x21d1;
        }
        else {
          cVar7 = ggml_are_same_shape(pgVar4,local_58);
          if (cVar7 != '\0') {
            cVar7 = ggml_are_same_shape(pgVar4,dst);
            if (cVar7 != '\0') {
              iVar1 = params->ith;
              iVar2 = params->nth;
              n = (uint)pgVar4->ne[0];
              local_48 = pgVar4;
              lVar8 = ggml_nrows();
              local_38 = ((long)iVar2 + -1 + lVar8) / (long)iVar2;
              lVar12 = iVar1 * local_38;
              local_38 = local_38 + lVar12;
              if (lVar8 <= local_38) {
                local_38 = lVar8;
              }
              local_4c = *pgVar3->data / (float)lVar8;
              local_40 = dst;
              for (; lVar12 < local_38; lVar12 = lVar12 + 1) {
                y = (float *)(local_40->nb[1] * lVar12 + (long)local_40->data);
                sVar5 = local_58->nb[1];
                x = (float *)(local_48->nb[1] * lVar12 + (long)local_48->data);
                pvVar6 = local_58->data;
                local_5c = -INFINITY;
                ggml_vec_max_f32(n,&local_5c,x);
                gVar13 = ggml_vec_soft_max_f32(n,y,x,local_5c);
                ggml_vec_scale_f32(n,y,(float)(1.0 / gVar13));
                for (uVar9 = 0; (~((int)n >> 0x1f) & n) != uVar9; uVar9 = uVar9 + 1) {
                  y[uVar9] = y[uVar9] - *(float *)((long)pvVar6 + uVar9 * 4 + sVar5 * lVar12);
                }
                ggml_vec_scale_f32(n,y,local_4c);
              }
              return;
            }
          }
          pcVar10 = "ggml_are_same_shape(src0f, src1f) && ggml_are_same_shape(src0f, dst)";
          uVar11 = 0x21d2;
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar11,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

void ggml_compute_forward_cross_entropy_loss_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_cross_entropy_loss_back_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}